

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * sqlite3VectorFieldSubexpr(Expr *pVector,int i)

{
  int iVar1;
  Select *pSVar2;
  
  iVar1 = sqlite3ExprIsVector(pVector);
  if (iVar1 != 0) {
    if ((pVector->op == 'w') || (pVector->op2 == 'w')) {
      pSVar2 = (pVector->x).pSelect;
    }
    else {
      pSVar2 = (Select *)&pVector->x;
    }
    pVector = pSVar2->pEList->a[i].pExpr;
  }
  return pVector;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3VectorFieldSubexpr(Expr *pVector, int i){
  assert( i<sqlite3ExprVectorSize(pVector) );
  if( sqlite3ExprIsVector(pVector) ){
    assert( pVector->op2==0 || pVector->op==TK_REGISTER );
    if( pVector->op==TK_SELECT || pVector->op2==TK_SELECT ){
      return pVector->x.pSelect->pEList->a[i].pExpr;
    }else{
      return pVector->x.pList->a[i].pExpr;
    }
  }
  return pVector;
}